

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O0

void nghttp3_qpack_decoder_init
               (nghttp3_qpack_decoder *decoder,size_t hard_max_dtable_capacity,
               size_t max_blocked_streams,nghttp3_mem *mem)

{
  size_t in_RCX;
  size_t in_RDX;
  nghttp3_qpack_context *in_RSI;
  long in_RDI;
  nghttp3_mem *in_stack_ffffffffffffffd8;
  
  qpack_context_init(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  *(undefined4 *)(in_RDI + 0x70) = 0;
  *(undefined4 *)(in_RDI + 0x74) = 0;
  *(undefined8 *)(in_RDI + 0x120) = 0;
  *(undefined8 *)(in_RDI + 0x128) = 0;
  *(undefined8 *)(in_RDI + 0x130) = 0;
  nghttp3_qpack_read_state_reset((nghttp3_qpack_read_state *)0x10e4c7);
  nghttp3_buf_init((nghttp3_buf *)(in_RDI + 0x100));
  return;
}

Assistant:

void nghttp3_qpack_decoder_init(nghttp3_qpack_decoder *decoder,
                                size_t hard_max_dtable_capacity,
                                size_t max_blocked_streams,
                                const nghttp3_mem *mem) {
  qpack_context_init(&decoder->ctx, hard_max_dtable_capacity,
                     max_blocked_streams, mem);

  decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
  decoder->opcode = 0;
  decoder->written_icnt = 0;
  decoder->max_concurrent_streams = 0;
  decoder->uninterrupted_encoderlen = 0;

  nghttp3_qpack_read_state_reset(&decoder->rstate);
  nghttp3_buf_init(&decoder->dbuf);
}